

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::QualifiedIdentifier::addToPath
          (QualifiedIdentifier *this,IdentifierPath *path,
          pool_ptr<soul::AST::Expression> *specialisationArgs)

{
  PathSection local_78;
  
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&local_78,&path->pathSections);
  local_78.specialisationArgs = (pool_ptr<soul::AST::Expression>)specialisationArgs->object;
  std::
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ::emplace_back<soul::AST::QualifiedIdentifier::PathSection>(&this->pathSections,&local_78);
  local_78.path.pathSections.numActive = 0;
  if ((8 < local_78.path.pathSections.numAllocated) &&
     (local_78.path.pathSections.items != (Identifier *)0x0)) {
    operator_delete__(local_78.path.pathSections.items);
  }
  return;
}

Assistant:

void addToPath (IdentifierPath path, pool_ptr<Expression> specialisationArgs)
        {
            pathSections.push_back ({ path, specialisationArgs });
        }